

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

HighsStatus
ipxSolutionToHighsSolution
          (HighsOptions *options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,HighsInt ipx_num_col,
          HighsInt ipx_num_row,vector<double,_std::allocator<double>_> *ipx_x,
          vector<double,_std::allocator<double>_> *ipx_slack_vars,
          vector<double,_std::allocator<double>_> *ipx_y,
          vector<double,_std::allocator<double>_> *ipx_zl,
          vector<double,_std::allocator<double>_> *ipx_zu,HighsModelStatus model_status,
          HighsSolution *highs_solution)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  int iVar14;
  ulong uVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  HighsLogOptions *log_options_;
  long lVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  vector<double,_std::allocator<double>_> final_row_activity;
  vector<double,_std::allocator<double>_> row_activity;
  double local_120;
  double local_118;
  uint local_10c;
  double local_f0;
  double local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  value_type_conflict1 local_38;
  
  this = &highs_solution->col_value;
  std::vector<double,_std::allocator<double>_>::resize(this,(long)lp->num_col_);
  this_00 = &highs_solution->row_value;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)lp->num_row_);
  this_01 = &highs_solution->col_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)lp->num_col_);
  this_02 = &highs_solution->row_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_02,(long)lp->num_row_);
  local_90 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_a8 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_88,(long)lp->num_row_,(value_type_conflict1 *)&local_c8);
  uVar15 = (ulong)lp->num_col_;
  dVar34 = 0.0;
  dVar26 = 0.0;
  if (0 < (long)uVar15) {
    pdVar2 = (ipx_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ipx_y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ipx_zl->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (ipx_zu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar23 = 0;
    do {
      dVar30 = pdVar2[uVar23];
      dVar29 = pdVar3[uVar23];
      iVar17 = piVar4[uVar23];
      lVar24 = (long)iVar17;
      iVar22 = piVar4[uVar23 + 1];
      if (iVar17 < iVar22) {
        do {
          iVar17 = piVar5[lVar24];
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar17] =
               pdVar6[lVar24] * dVar30 +
               local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar17];
          dVar29 = dVar29 - pdVar7[iVar17] * pdVar6[lVar24];
          lVar24 = lVar24 + 1;
        } while (iVar22 != lVar24);
      }
      dVar32 = pdVar8[uVar23] - pdVar9[uVar23];
      pdVar10[uVar23] = dVar30;
      pdVar11[uVar23] = dVar32;
      uVar23 = uVar23 + 1;
      dVar30 = ABS(dVar29 - dVar32);
      if (dVar26 <= dVar30) {
        dVar26 = dVar30;
      }
    } while (uVar23 != uVar15);
  }
  iVar17 = lp->num_row_;
  if (0 < (long)iVar17) {
    pdVar2 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ipx_slack_vars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ipx_y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (ipx_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (ipx_zl->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (ipx_zu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar34 = 0.0;
    lVar24 = 0;
    iVar22 = 0;
    do {
      dVar26 = pdVar2[lVar24];
      dVar30 = pdVar3[lVar24];
      if ((-INFINITY < dVar26) || (dVar30 < INFINITY)) {
        if ((dVar26 == -INFINITY) || ((dVar30 == INFINITY || (dVar30 <= dVar26)))) {
          dVar26 = pdVar6[iVar22] - pdVar7[iVar22];
          dVar30 = pdVar8[iVar22];
        }
        else {
          iVar14 = (int)uVar15;
          dVar26 = pdVar9[iVar14];
          dVar30 = pdVar10[iVar14] - pdVar11[iVar14];
          uVar15 = (ulong)(iVar14 + 1);
        }
        if (dVar34 <= ABS(dVar26 - local_88.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar24])) {
          dVar34 = ABS(dVar26 - local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar24]);
        }
        pdVar12[lVar24] = dVar26;
        pdVar13[lVar24] = dVar30;
        iVar22 = iVar22 + 1;
      }
      else {
        pdVar12[lVar24] =
             local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar24];
        pdVar13[lVar24] = 0.0;
      }
      lVar24 = lVar24 + 1;
    } while (iVar17 != lVar24);
  }
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  highsLogDev(log_options_,kInfo,
              "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n");
  highsLogDev(log_options_,kInfo,
              "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n",dVar34);
  if (model_status == kOptimal) {
    uVar18 = lp->num_col_;
    uVar15 = (ulong)uVar18;
    iVar17 = lp->num_row_ + uVar18;
    if (iVar17 == 0 || SCARRY4(lp->num_row_,uVar18) != iVar17 < 0) {
      uVar20 = 0;
      local_f0 = 0.0;
      local_120 = 0.0;
      local_118 = 0.0;
      dVar26 = 0.0;
      local_d0 = 0.0;
      uVar19 = 0;
      uVar23 = 0;
      local_10c = 0;
    }
    else {
      uVar21 = 0;
      local_10c = 0;
      uVar23 = 0;
      uVar19 = 0;
      uVar20 = 0;
      local_d0 = 0.0;
      dVar26 = 0.0;
      local_f0 = 0.0;
      dVar34 = 0.0;
      dVar30 = 0.0;
      do {
        uVar18 = (uint)uVar19;
        local_120 = dVar30;
        local_118 = dVar34;
        if (uVar21 == (uVar15 & 0xffffffff)) {
          local_120 = 0.0;
          local_118 = 0.0;
          uVar19 = 0;
          uVar23 = uVar20;
          uVar20 = 0;
          dVar26 = dVar34;
          local_10c = uVar18;
          local_d0 = dVar30;
        }
        lVar24 = (long)(int)uVar15;
        iVar17 = (int)uVar21;
        if ((long)uVar21 < lVar24) {
          dVar29 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          dVar32 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          dVar30 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          dVar34 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
        }
        else {
          iVar17 = iVar17 - (int)uVar15;
          dVar34 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          dVar30 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          dVar29 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          dVar32 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          if (iVar17 == -0x25) {
            uStack_40 = 0;
            uStack_50 = 0;
            uStack_60 = 0;
            local_a0 = dVar34;
            local_98 = dVar26;
            local_68 = dVar30;
            local_58 = dVar32;
            local_48 = dVar29;
            printf("Row %d\n",0xffffffdb);
            iVar17 = -0x25;
            dVar26 = local_98;
            dVar29 = local_48;
            dVar32 = local_58;
            dVar30 = local_68;
            dVar34 = local_a0;
          }
        }
        if (dVar34 < dVar30) {
          dVar27 = local_90 + dVar34;
          dVar28 = dVar30 - local_90;
          if ((dVar27 < dVar29) || (dVar29 < dVar28)) {
            if (dVar29 <= dVar27) {
              dVar31 = -dVar32;
            }
            else {
              dVar31 = dVar32;
              if (dVar29 < dVar28) {
                dVar31 = ABS(dVar32);
              }
            }
            if (local_a8 < dVar31) {
              dVar33 = dVar29 - dVar30;
              if (dVar29 - dVar30 <= dVar34 - dVar29) {
                dVar33 = dVar34 - dVar29;
              }
              if (dVar31 <= ABS(dVar33)) {
                uVar19 = (ulong)((int)uVar19 + 1);
                dVar34 = dVar29;
                if (dVar29 <= dVar27) {
                  dVar27 = -0.0;
                }
                else {
                  dVar27 = 0.0;
                  if (dVar29 < dVar28) {
                    dVar27 = (double)(~-(ulong)(0.0 < dVar32) & 0x8000000000000000);
                  }
                }
              }
              else {
                uVar20 = (ulong)((int)uVar20 + 1);
                dVar27 = dVar32;
                if (dVar32 <= 0.0) {
                  dVar34 = dVar30;
                  if (dVar30 <= dVar29) {
                    dVar34 = dVar30 + 0.0;
                  }
                }
                else if (dVar34 <= dVar29) {
                  dVar34 = dVar34 + 0.0;
                }
              }
              if (local_118 <= ABS(dVar29 - dVar34)) {
                local_118 = ABS(dVar29 - dVar34);
              }
              if (local_120 <= ABS(dVar32 - dVar27)) {
                local_120 = ABS(dVar32 - dVar27);
              }
              if (local_f0 <= ABS(dVar34)) {
                local_f0 = ABS(dVar34);
              }
              pvVar16 = this_00;
              if ((long)uVar21 < lVar24) {
                pvVar16 = this;
              }
              (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar17] = dVar34;
              pvVar16 = this_02;
              if ((long)uVar21 < lVar24) {
                pvVar16 = this_01;
              }
              (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar17] = dVar27;
            }
          }
        }
        uVar21 = uVar21 + 1;
        uVar15 = (ulong)lp->num_col_;
        dVar34 = local_118;
        dVar30 = local_120;
      } while ((long)uVar21 < (long)((long)lp->num_row_ + uVar15));
    }
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal truncations is %10.4g\n",dVar26
                ,uVar23);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal truncations is %10.4g\n",
                local_118,uVar20);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual truncations is %10.4g\n",
                local_d0,(ulong)local_10c);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual truncations is %10.4g\n",
                local_120,uVar19);
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_c8,(long)lp->num_row_,&local_38);
    iVar17 = lp->num_col_;
    local_120 = 0.0;
    if (0 < (long)iVar17) {
      pdVar2 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_120 = 0.0;
      lVar24 = 0;
      do {
        dVar26 = pdVar2[lVar24];
        iVar22 = piVar4[lVar24];
        lVar25 = (long)iVar22;
        iVar14 = piVar4[lVar24 + 1];
        if (iVar22 < iVar14) {
          do {
            iVar22 = piVar5[lVar25];
            local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar22] =
                 pdVar3[lVar24] * pdVar6[lVar25] +
                 local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
            dVar26 = dVar26 - pdVar7[iVar22] * pdVar6[lVar25];
            lVar25 = lVar25 + 1;
          } while (iVar14 != lVar25);
        }
        pdVar1 = pdVar8 + lVar24;
        lVar24 = lVar24 + 1;
        dVar26 = ABS(dVar26 - *pdVar1);
        if (local_120 <= dVar26) {
          local_120 = dVar26;
        }
      } while (lVar24 != iVar17);
    }
    if (0 < (long)lp->num_row_) {
      dVar26 = 0.0;
      lVar24 = 0;
      do {
        dVar34 = ABS(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24] -
                     (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar24]);
        if (dVar26 <= dVar34) {
          dVar26 = dVar34;
        }
        lVar24 = lVar24 + 1;
      } while (lp->num_row_ != lVar24);
    }
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Final norm of primal residual values is %10.4g\n");
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Final norm of dual   residual values is %10.4g\n",
                local_120);
    if (1e+25 < local_f0) {
      printf("ipxSolutionToHighsSolution: Excessive corrected |primal value| is %10.4g\n");
    }
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (lp->sense_ == kMaximize) {
    iVar17 = lp->num_col_;
    if (0 < (long)iVar17) {
      pdVar2 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar24 = 0;
      do {
        pdVar2[lVar24] = -pdVar2[lVar24];
        lVar24 = lVar24 + 1;
      } while (iVar17 != lVar24);
    }
    iVar17 = lp->num_row_;
    if (0 < (long)iVar17) {
      pdVar2 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar24 = 0;
      do {
        pdVar2[lVar24] = -pdVar2[lVar24];
        lVar24 = lVar24 + 1;
      } while (iVar17 != lVar24);
    }
  }
  highs_solution->value_valid = true;
  highs_solution->dual_valid = true;
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus ipxSolutionToHighsSolution(
    const HighsOptions& options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const HighsInt ipx_num_col, const HighsInt ipx_num_row,
    const std::vector<double>& ipx_x, const std::vector<double>& ipx_slack_vars,
    const std::vector<double>& ipx_y, const std::vector<double>& ipx_zl,
    const std::vector<double>& ipx_zu, const HighsModelStatus model_status,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);

  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  const std::vector<double>& ipx_col_value = ipx_x;
  const std::vector<double>& ipx_row_value = ipx_slack_vars;

  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  const bool get_row_activities = true;  // ipx_num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt ipx_slack = lp.num_col_;
  assert(ipx_num_row == lp.num_row_);
  double dual_residual_norm = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = ipx_col_value[col];
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] += value * lp.a_matrix_.value_[el];
        check_dual -= ipx_y[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - (ipx_zl[col] - ipx_zu[col]));
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double dual = ipx_zl[col] - ipx_zu[col];
    highs_solution.col_value[col] = value;
    highs_solution.col_dual[col] = dual;
  }
  HighsInt ipx_row = 0;
  ipx_slack = lp.num_col_;
  double delta_norm = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so set it to its row activity
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
      continue;
    }
    // Non-free row, so IPX will have it
    double value = 0;
    double dual = 0;
    if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
      assert(constraint_type[ipx_row] == '=');
      // Boxed row - look at its slack
      value = ipx_col_value[ipx_slack];
      dual = ipx_zl[ipx_slack] - ipx_zu[ipx_slack];
      // Update the slack to be used for boxed rows
      ipx_slack++;
    } else {
      value = rhs[ipx_row] - ipx_row_value[ipx_row];
      dual = ipx_y[ipx_row];
    }
    delta_norm = std::max(std::fabs(value - row_activity[row]), delta_norm);
    highs_solution.row_value[row] = value;
    highs_solution.row_dual[row] = dual;
    // Update the IPX row index
    ipx_row++;
  }
  //  if (delta_norm >= dual_feasibility_tolerance)
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n",
      dual_residual_norm);
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n",
      delta_norm);
  const bool force_dual_feasibility = false;  // true;
  const bool minimal_truncation = true;
  if (model_status == HighsModelStatus::kOptimal &&
      (force_dual_feasibility || minimal_truncation)) {
    double primal_truncation_norm = 0;
    double dual_truncation_norm = 0;
    double col_primal_truncation_norm = 0;
    double col_dual_truncation_norm = 0;
    HighsInt num_primal_truncations = 0;
    HighsInt num_dual_truncations = 0;
    HighsInt num_col_primal_truncations = 0;
    HighsInt num_col_dual_truncations = 0;
    HighsInt col = 0, row = 0;
    double lower, upper, value, dual;
    const HighsInt check_col = -127;
    const HighsInt check_row = -37;
    // Truncating to tolerances can lead to infeasibilities by margin
    // of machine precision
    const double primal_margin = 0;  // primal_feasibility_tolerance;
    const double dual_margin = 0;    // dual_feasibility_tolerance;
    double max_abs_primal_value = 0;
    for (HighsInt var = 0; var < lp.num_col_ + lp.num_row_; var++) {
      if (var == lp.num_col_) {
        col_primal_truncation_norm = primal_truncation_norm;
        col_dual_truncation_norm = dual_truncation_norm;
        num_col_primal_truncations = num_primal_truncations;
        num_col_dual_truncations = num_dual_truncations;
        primal_truncation_norm = 0;
        dual_truncation_norm = 0;
        num_primal_truncations = 0;
        num_dual_truncations = 0;
      }
      const bool is_col = var < lp.num_col_;
      if (is_col) {
        col = var;
        lower = lp.col_lower_[col];
        upper = lp.col_upper_[col];
        value = highs_solution.col_value[col];
        dual = highs_solution.col_dual[col];
        if (col == check_col) {
          printf("Column %d\n", (int)check_col);
        }
      } else {
        row = var - lp.num_col_;
        lower = lp.row_lower_[row];
        upper = lp.row_upper_[row];
        value = highs_solution.row_value[row];
        dual = highs_solution.row_dual[row];
        if (row == check_row) {
          printf("Row %d\n", (int)check_row);
        }
      }
      // Continue if equality: cannot have dual infeasibility
      if (lower >= upper) continue;
      double dual_truncation = 0;
      double primal_truncation = 0;
      double dual_infeasibility = 0;
      double residual = std::fabs(std::max(lower - value, value - upper));
      double new_value = value;
      double new_dual = dual;
      const bool at_lower = value <= lower + primal_feasibility_tolerance;
      const bool at_upper = value >= upper - primal_feasibility_tolerance;
      // Continue if at distinct bounds: cannot have dual infeasibility
      if (at_lower && at_upper) continue;
      if (at_lower) {
        dual_infeasibility = -dual;
      } else if (at_upper) {
        dual_infeasibility = dual;
      } else {
        dual_infeasibility = std::fabs(dual);
      }
      // Continue if no dual infeasibility
      if (dual_infeasibility <= dual_feasibility_tolerance) continue;

      if (residual < dual_infeasibility && !force_dual_feasibility) {
        /*
          // Residual is less than dual infeasibility, or not forcing
          // dual feasibility, so truncate value
          if (at_lower) {
            assert(10 == 50);
          } else if (at_upper) {
            assert(11 == 50);
          } else {
            // Off bound
            if (lower <= -kHighsInf) {
              if (upper >= kHighsInf) {
                // Free shouldn't be possible, as residual would be inf
                assert(12 == 50);
              } else {
                // Upper bounded, so assume dual is negative
                if (dual > 0) assert(13 == 50);
              }
            } else if (upper >= kHighsInf) {
              // Lower bounded, so assume dual is positive
              if (dual < 0) assert(14 == 50);
            }
          }
        */
        num_primal_truncations++;
        if (dual > 0) {
          // Put closest to lower
          if (value < lower) {
            new_value = lower - primal_margin;
          } else {
            new_value = lower + primal_margin;
          }
        } else {
          // Put closest to upper
          if (value < upper) {
            new_value = upper - primal_margin;
          } else {
            new_value = upper + primal_margin;
          }
        }
      } else {
        // Residual is greater than dual infeasibility, or forcing
        // dual feasibility, so truncate dual
        num_dual_truncations++;
        if (at_lower) {
          // At lower bound, so possibly truncate to -dual_margin
          new_dual = -dual_margin;
        } else if (at_upper) {
          // At upper bound, so possibly truncate to dual_margin
          new_dual = dual_margin;
        } else {
          // Between bounds so possibly set dual to signed dual_margin
          if (dual > 0) {
            new_dual = dual_margin;
          } else {
            new_dual = -dual_margin;
          }
        }
      }
      primal_truncation = std::fabs(value - new_value);
      dual_truncation = std::fabs(dual - new_dual);
      primal_truncation_norm =
          std::max(primal_truncation, primal_truncation_norm);
      dual_truncation_norm = std::max(dual_truncation, dual_truncation_norm);
      /*if (dual_truncation > 1e-2 || primal_truncation > 1e-2)
        printf(
            "%s %4d: [%11.4g, %11.4g, %11.4g] residual = %11.4g; new = %11.4g; "
            "truncation = %11.4g | "
            "dual = %11.4g; new = %11.4g; truncation = %11.4g\n",
            is_col ? "Col" : "Row", (int)(is_col ? col : row), lower, value,
            upper, residual, new_value, primal_truncation, dual, new_dual,
            dual_truncation);
      */
      max_abs_primal_value =
          std::max(std::abs(new_value), max_abs_primal_value);
      if (is_col) {
        highs_solution.col_value[col] = new_value;
        highs_solution.col_dual[col] = new_dual;
      } else {
        highs_solution.row_value[row] = new_value;
        highs_solution.row_dual[row] = new_dual;
      }
    }
    // Assess the truncations
    //  if (dual_truncation_norm >= dual_margin)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal "
                "truncations is %10.4g\n",
                num_col_primal_truncations, col_primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal "
                "truncations is %10.4g\n",
                num_primal_truncations, primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual "
                "truncations is %10.4g\n",
                num_col_dual_truncations, col_dual_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual "
                "truncations is %10.4g\n",
                num_dual_truncations, dual_truncation_norm);
    // Determine the new residuals

    vector<double> final_row_activity;
    final_row_activity.assign(lp.num_row_, 0);
    dual_residual_norm = 0;
    for (HighsInt col = 0; col < lp.num_col_; col++) {
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        final_row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
        check_dual -= highs_solution.row_dual[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - highs_solution.col_dual[col]);
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double primal_residual_norm = 0;
    for (HighsInt row = 0; row < lp.num_row_; row++) {
      double primal_residual =
          std::fabs(final_row_activity[row] - highs_solution.row_value[row]);
      primal_residual_norm = std::max(primal_residual, primal_residual_norm);
    }
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of primal residual "
                "values is %10.4g\n",
                primal_residual_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of dual   residual "
                "values is %10.4g\n",
                dual_residual_norm);
    if (max_abs_primal_value > kExcessivePrimalValue) {
      //    highsLogUser(options.log_options, HighsLogType::kInfo,
      printf(
          "ipxSolutionToHighsSolution: "
          "Excessive corrected |primal value| is %10.4g\n",
          max_abs_primal_value);
    }
  }
  assert(ipx_row == ipx_num_row);
  assert(ipx_slack == ipx_num_col);
  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  // Indicate that the primal and dual solution are known
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  return HighsStatus::kOk;
}